

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_version.cc
# Opt level: O0

void rbdl_check_api_version(int version)

{
  ostream *poVar1;
  uint in_EDI;
  ostringstream link_version_string;
  int version_patch;
  int version_minor;
  int version_major;
  ostringstream compile_version_string;
  int compile_patch;
  int compile_minor;
  int compile_major;
  int compile_version;
  allocator<char> *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [39];
  allocator<char> local_369;
  string local_368 [32];
  ostringstream local_348 [376];
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  allocator<char> local_1b1;
  string local_1b0 [32];
  ostringstream local_190 [380];
  uint local_14;
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_4 = in_EDI;
  local_8 = rbdl_get_api_version();
  local_c = local_8 >> 0x10 & 0xff;
  local_10 = local_8 >> 8 & 0xff;
  local_14 = local_8 & 0xff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::__cxx11::ostringstream::ostringstream(local_190,local_1b0,_S_out);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,local_c);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1,".");
  std::ostream::operator<<(poVar1,local_14);
  local_1c8 = local_4 >> 0x10 & 0xff;
  local_1cc = local_4 >> 8 & 0xff;
  local_1d0 = local_4 & 0xff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::__cxx11::ostringstream::ostringstream(local_348,local_368,_S_out);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  poVar1 = (ostream *)std::ostream::operator<<(local_348,local_1c8);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1cc);
  poVar1 = std::operator<<(poVar1,".");
  std::ostream::operator<<(poVar1,local_1d0);
  if (local_1c8 != local_c) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Error: trying to link against an incompatible RBDL library.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cerr,"The library version is: ");
    std::__cxx11::ostringstream::str();
    poVar1 = std::operator<<(poVar1,local_390);
    poVar1 = std::operator<<(poVar1," but rbdl_config.h is version ");
    std::__cxx11::ostringstream::str();
    poVar1 = std::operator<<(poVar1,local_3b0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_390);
    abort();
  }
  if (local_1cc != local_10) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Warning: RBDL library is of version ");
    std::__cxx11::ostringstream::str();
    poVar1 = std::operator<<(poVar1,local_3d0);
    poVar1 = std::operator<<(poVar1," but rbdl_config.h is from version ");
    std::__cxx11::ostringstream::str();
    poVar1 = std::operator<<(poVar1,local_3f0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3f0);
    std::__cxx11::string::~string(local_3d0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_348);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

RBDL_DLLAPI void rbdl_check_api_version(int version) {
  int compile_version = rbdl_get_api_version();

  int compile_major = (compile_version & 0xff0000) >> 16;
  int compile_minor = (compile_version & 0x00ff00) >> 8;
  int compile_patch = (compile_version & 0x0000ff);

  std::ostringstream compile_version_string("");
  compile_version_string << compile_major << "." << compile_minor << "."
    << compile_patch;

  int version_major = (version & 0xff0000) >> 16;
  int version_minor = (version & 0x00ff00) >> 8;
  int version_patch = (version & 0x0000ff);

  std::ostringstream link_version_string ("");
  link_version_string << version_major << "." << version_minor << "."
    << version_patch;

  if (version_major != compile_major) {
    std::cerr << "Error: trying to link against an incompatible RBDL library."
      << std::endl;
    std::cerr << "The library version is: " << compile_version_string.str()
      << " but rbdl_config.h is version " << link_version_string.str()
      << std::endl;
    abort();
  } else if (version_minor != compile_minor) {
    std::cout << "Warning: RBDL library is of version "
      << compile_version_string.str() << " but rbdl_config.h is from version "
      << link_version_string.str() << std::endl;
  }
}